

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O2

void __thiscall
TPZFrontNonSym<std::complex<double>_>::AddKel
          (TPZFrontNonSym<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *elmat,
          TPZVec<long> *sourceindex,TPZVec<long> *destinationindex)

{
  complex<double> *pcVar1;
  long lVar2;
  complex<double> *pcVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  complex<double> *pcVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  lVar2 = sourceindex->fNElements;
  lVar11 = 0;
  lVar8 = 0;
  if (0 < lVar2) {
    lVar8 = lVar2;
  }
  for (; lVar11 != lVar8; lVar11 = lVar11 + 1) {
    iVar6 = Local(this,destinationindex->fStore[lVar11]);
    for (lVar12 = 0; lVar2 != lVar12; lVar12 = lVar12 + 1) {
      iVar7 = Local(this,destinationindex->fStore[lVar12]);
      pcVar9 = TPZFMatrix<std::complex<double>_>::operator()
                         (elmat,sourceindex->fStore[lVar11],sourceindex->fStore[lVar12]);
      lVar10 = (long)(this->super_TPZFront<std::complex<double>_>).fMaxFront * (long)iVar7;
      pcVar3 = (this->super_TPZFront<std::complex<double>_>).fData.fStore;
      dVar4 = *(double *)(pcVar9->_M_value + 8);
      pcVar1 = pcVar3 + lVar10 + iVar6;
      dVar5 = *(double *)(pcVar1->_M_value + 8);
      pcVar3 = pcVar3 + lVar10 + iVar6;
      *(double *)pcVar3->_M_value = *(double *)pcVar1->_M_value + *(double *)pcVar9->_M_value;
      *(double *)(pcVar3->_M_value + 8) = dVar5 + dVar4;
    }
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &sourceindex,  TPZVec<int64_t> &destinationindex)
{
	int64_t i, j, ilocal, jlocal, nel;
	nel=sourceindex.NElements();
	for (i = 0; i < nel; i++) {
		// message #1.1.1 to this:TPZFront
		ilocal = this->Local(destinationindex[i]);
		for (j = 0; j < nel; j++) {
			// message #1.1.2.1 to this:TPZFront
			jlocal = this->Local(destinationindex[j]);
			
			// message #1.1.2.2 to this:TPZFront
			this->Element(ilocal, jlocal)+=elmat(sourceindex[i],sourceindex[j]);
		}
	}
}